

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

ptrdiff_t __thiscall pugi::xml_node::offset_debug(xml_node *this)

{
  long lVar1;
  ptrdiff_t pVar2;
  char_t *pcVar3;
  uint uVar4;
  xml_node_struct *pxVar5;
  xml_node local_10;
  
  if (this->_root == (xml_node_struct *)0x0) {
    xml_node(&local_10);
  }
  else {
    lVar1 = *(long *)(this->_root->header & 0xffffffffffffffe0);
    pxVar5 = (xml_node_struct *)(lVar1 + -0x40);
    if (lVar1 == 0) {
      pxVar5 = (xml_node_struct *)0x0;
    }
    xml_node(&local_10,pxVar5);
  }
  pVar2 = -1;
  if ((local_10._root != (xml_node_struct *)0x0) && (local_10._root[1].name != (char_t *)0x0)) {
    pxVar5 = this->_root;
    if (pxVar5 == (xml_node_struct *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = ((uint)pxVar5->header & 7) + 1;
    }
    if (uVar4 < 9) {
      if ((0x138U >> uVar4 & 1) == 0) {
        if ((0xc4U >> uVar4 & 1) == 0) {
          if (uVar4 != 1) {
            return -1;
          }
          return 0;
        }
        if ((pxVar5->header & 0x10) != 0) {
          return -1;
        }
        pcVar3 = pxVar5->name;
      }
      else {
        if ((pxVar5->header & 8) != 0) {
          return -1;
        }
        pcVar3 = pxVar5->value;
      }
      pVar2 = (long)pcVar3 - (long)local_10._root[1].name;
    }
  }
  return pVar2;
}

Assistant:

PUGI__FN ptrdiff_t xml_node::offset_debug() const
	{
		xml_node_struct* r = root()._root;

		if (!r) return -1;

		const char_t* buffer = static_cast<impl::xml_document_struct*>(r)->buffer;

		if (!buffer) return -1;

		switch (type())
		{
		case node_document:
			return 0;

		case node_element:
		case node_declaration:
		case node_pi:
			return (_root->header & impl::xml_memory_page_name_allocated_mask) ? -1 : _root->name - buffer;

		case node_pcdata:
		case node_cdata:
		case node_comment:
		case node_doctype:
			return (_root->header & impl::xml_memory_page_value_allocated_mask) ? -1 : _root->value - buffer;

		default:
			return -1;
		}
	}